

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputVenueMessageContent.h
# Opt level: O2

void __thiscall
TgBot::InputVenueMessageContent::InputVenueMessageContent(InputVenueMessageContent *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"InputVenueMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputVenueMessageContent_002cfa10;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  (this->foursquareId)._M_dataplus._M_p = (pointer)&(this->foursquareId).field_2;
  (this->foursquareId)._M_string_length = 0;
  (this->foursquareId).field_2._M_local_buf[0] = '\0';
  (this->foursquareType)._M_dataplus._M_p = (pointer)&(this->foursquareType).field_2;
  (this->foursquareType)._M_string_length = 0;
  (this->foursquareType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputVenueMessageContent() :
        InputMessageContent("InputVenueMessageContent")
    {}